

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_7c1cc8::TargetCompileFeaturesImpl::HandleDirectContent
          (TargetCompileFeaturesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  bool bVar1;
  undefined1 local_78 [8];
  string error;
  string *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmStandardLevelResolver standardResolver;
  bool param_4_local;
  bool param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  TargetCompileFeaturesImpl *this_local;
  
  standardResolver.Makefile._6_1_ = param_4;
  standardResolver.Makefile._7_1_ = param_3;
  cmStandardLevelResolver::cmStandardLevelResolver
            ((cmStandardLevelResolver *)&__range2,(this->super_cmTargetPropCommandBase).Makefile);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(content);
  it = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(content);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&it), bVar1) {
    error.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end2);
    std::__cxx11::string::string((string *)local_78);
    bVar1 = cmStandardLevelResolver::AddRequiredTargetFeature
                      ((cmStandardLevelResolver *)&__range2,tgt,(string *)error.field_2._8_8_,
                       (string *)local_78);
    if (!bVar1) {
      ::cmTargetPropCommandBase::SetError(&this->super_cmTargetPropCommandBase,(string *)local_78);
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_78);
    if (!bVar1) goto LAB_0048cf53;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  this_local._7_1_ = 1;
LAB_0048cf53:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool /*prepend*/, bool /*system*/) override
  {
    cmStandardLevelResolver standardResolver(this->Makefile);
    for (std::string const& it : content) {
      std::string error;
      if (!standardResolver.AddRequiredTargetFeature(tgt, it, &error)) {
        this->SetError(error);
        return false; // Not (successfully) handled.
      }
    }
    return true; // Successfully handled.
  }